

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

char * read_referenced_name
                 (dwarf_data *ddata,unit *u,uint64_t offset,backtrace_error_callback error_callback,
                 void *data)

{
  undefined8 uVar1;
  int iVar2;
  uint64_t code;
  char *pcVar3;
  ulong uVar4;
  char *unaff_R13;
  long lVar5;
  undefined1 local_178 [8];
  char b [200];
  undefined1 local_a8 [8];
  dwarf_buf unit_buf;
  char *local_60;
  char *s;
  backtrace_error_callback local_50;
  void *local_48;
  char *local_40;
  char *ret;
  
  uVar4 = offset - u->unit_data_offset;
  ret = (char *)ddata;
  if ((offset < u->unit_data_offset) ||
     (unit_buf.buf = (uchar *)(u->unit_data_len - uVar4),
     u->unit_data_len < uVar4 || unit_buf.buf == (uchar *)0x0)) {
    (*error_callback)(data,"abstract origin or specification out of range",0);
    local_40 = (char *)0x0;
  }
  else {
    local_a8 = (undefined1  [8])0x1391a1;
    unit_buf.name = (char *)(ddata->dwarf_sections).data[0];
    unit_buf.start = u->unit_data + uVar4;
    unit_buf.left._0_4_ = ddata->is_bigendian;
    unit_buf.data._0_4_ = 0;
    unit_buf._32_8_ = error_callback;
    unit_buf.error_callback = (backtrace_error_callback)data;
    code = read_uleb128((dwarf_buf *)local_a8);
    if (code == 0) {
      snprintf(local_178,200,"%s in %s at %d","invalid abstract origin or specification",local_a8,
               (ulong)(uint)((int)unit_buf.start - (int)unit_buf.name));
      (*(code *)unit_buf._32_8_)(unit_buf.error_callback,local_178,0);
      local_40 = (char *)0x0;
    }
    else {
      unit_buf._56_8_ = lookup_abbrev(&u->abbrevs,code,error_callback,data);
      if ((abbrev *)unit_buf._56_8_ == (abbrev *)0x0) {
        local_40 = (char *)0x0;
      }
      else {
        local_40 = (char *)0x0;
        if (((abbrev *)unit_buf._56_8_)->num_attrs != 0) {
          s = ret + 0x38;
          lVar5 = 0;
          uVar4 = 0;
          local_50 = error_callback;
          local_48 = data;
          do {
            uVar1 = unit_buf._56_8_;
            iVar2 = read_attribute(*(dwarf_form *)(*(long *)(unit_buf._56_8_ + 0x18) + 4 + lVar5),
                                   *(uint64_t *)(*(long *)(unit_buf._56_8_ + 0x18) + 8 + lVar5),
                                   (dwarf_buf *)local_a8,u->is_dwarf64,u->version,u->addrsize,
                                   (dwarf_sections *)s,*(dwarf_data **)(ret + 8),
                                   (attr_val *)local_178);
            if (iVar2 == 0) {
LAB_00132e44:
              pcVar3 = (char *)0x0;
              unaff_R13 = (char *)0x0;
            }
            else {
              iVar2 = *(int *)(*(long *)(uVar1 + 0x18) + lVar5);
              if (iVar2 < 0x6e) {
                if (iVar2 == 3) {
                  if ((local_40 == (char *)0x0) &&
                     (iVar2 = resolve_string((dwarf_sections *)s,u->is_dwarf64,*(int *)(ret + 200),
                                             u->str_offsets_base,(attr_val *)local_178,local_50,
                                             local_48,&local_40), iVar2 == 0)) goto LAB_00132e44;
                }
                else if ((iVar2 == 0x47) &&
                        (pcVar3 = read_referenced_name_from_attr
                                            ((dwarf_data *)ret,u,
                                             (attr *)(*(long *)(uVar1 + 0x18) + lVar5),
                                             (attr_val *)local_178,local_50,local_48),
                        pcVar3 != (char *)0x0)) {
                  local_40 = pcVar3;
                }
              }
              else if ((iVar2 == 0x6e) || (iVar2 == 0x2007)) {
                pcVar3 = (char *)0x0;
                local_60 = (char *)0x0;
                iVar2 = resolve_string((dwarf_sections *)s,u->is_dwarf64,*(int *)(ret + 200),
                                       u->str_offsets_base,(attr_val *)local_178,local_50,local_48,
                                       &local_60);
                if (local_60 != (char *)0x0) {
                  unaff_R13 = local_60;
                }
                if (iVar2 == 0) {
                  unaff_R13 = pcVar3;
                }
                if (iVar2 == 0 || local_60 != (char *)0x0) goto LAB_00132e49;
              }
              pcVar3 = (char *)0x1;
            }
LAB_00132e49:
            if ((char)pcVar3 == '\0') {
              return unaff_R13;
            }
            uVar4 = uVar4 + 1;
            lVar5 = lVar5 + 0x10;
          } while (uVar4 < *(ulong *)(unit_buf._56_8_ + 0x10));
        }
      }
    }
  }
  return local_40;
}

Assistant:

static const char *
read_referenced_name (struct dwarf_data *ddata, struct unit *u,
		      uint64_t offset, backtrace_error_callback error_callback,
		      void *data)
{
  struct dwarf_buf unit_buf;
  uint64_t code;
  const struct abbrev *abbrev;
  const char *ret;
  size_t i;

  /* OFFSET is from the start of the data for this compilation unit.
     U->unit_data is the data, but it starts U->unit_data_offset bytes
     from the beginning.  */

  if (offset < u->unit_data_offset
      || offset - u->unit_data_offset >= u->unit_data_len)
    {
      error_callback (data,
		      "abstract origin or specification out of range",
		      0);
      return NULL;
    }

  offset -= u->unit_data_offset;

  unit_buf.name = ".debug_info";
  unit_buf.start = ddata->dwarf_sections.data[DEBUG_INFO];
  unit_buf.buf = u->unit_data + offset;
  unit_buf.left = u->unit_data_len - offset;
  unit_buf.is_bigendian = ddata->is_bigendian;
  unit_buf.error_callback = error_callback;
  unit_buf.data = data;
  unit_buf.reported_underflow = 0;

  code = read_uleb128 (&unit_buf);
  if (code == 0)
    {
      dwarf_buf_error (&unit_buf,
		       "invalid abstract origin or specification",
		       0);
      return NULL;
    }

  abbrev = lookup_abbrev (&u->abbrevs, code, error_callback, data);
  if (abbrev == NULL)
    return NULL;

  ret = NULL;
  for (i = 0; i < abbrev->num_attrs; ++i)
    {
      struct attr_val val;

      if (!read_attribute (abbrev->attrs[i].form, abbrev->attrs[i].val,
			   &unit_buf, u->is_dwarf64, u->version, u->addrsize,
			   &ddata->dwarf_sections, ddata->altlink, &val))
	return NULL;

      switch (abbrev->attrs[i].name)
	{
	case DW_AT_name:
	  /* Third name preference: don't override.  A name we found in some
	     other way, will normally be more useful -- e.g., this name is
	     normally not mangled.  */
	  if (ret != NULL)
	    break;
	  if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
			       ddata->is_bigendian, u->str_offsets_base,
			       &val, error_callback, data, &ret))
	    return NULL;
	  break;

	case DW_AT_linkage_name:
	case DW_AT_MIPS_linkage_name:
	  /* First name preference: override all.  */
	  {
	    const char *s;

	    s = NULL;
	    if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
				 ddata->is_bigendian, u->str_offsets_base,
				 &val, error_callback, data, &s))
	      return NULL;
	    if (s != NULL)
	      return s;
	  }
	  break;

	case DW_AT_specification:
	  /* Second name preference: override DW_AT_name, don't override
	     DW_AT_linkage_name.  */
	  {
	    const char *name;

	    name = read_referenced_name_from_attr (ddata, u, &abbrev->attrs[i],
						   &val, error_callback, data);
	    if (name != NULL)
	      ret = name;
	  }
	  break;

	default:
	  break;
	}
    }

  return ret;
}